

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_draw.cxx
# Opt level: O0

void gl_draw(char *str,int n)

{
  uint r_00;
  int local_1c;
  uint r;
  int i;
  int wn;
  int n_local;
  char *str_local;
  
  r = fl_utf8toUtf16(str,n,gl_draw::buf,gl_draw::l);
  if (gl_draw::l <= (int)r) {
    gl_draw::buf = (unsigned_short *)realloc(gl_draw::buf,(long)(int)(r + 1) << 1);
    gl_draw::l = r + 1;
    r = fl_utf8toUtf16(str,n,gl_draw::buf,gl_draw::l);
  }
  for (local_1c = 0; local_1c < (int)r; local_1c = local_1c + 1) {
    r_00 = (int)((int)str[local_1c] & 0xfc00U) >> 10;
    if (gl_fontsize->glok[r_00] == '\0') {
      get_list(r_00);
    }
  }
  glCallLists(r,0x1403,gl_draw::buf);
  return;
}

Assistant:

void gl_draw(const char* str, int n) {
#ifdef __APPLE__  
  gl_draw_textures(str, n);
#else
  static xchar *buf = NULL;
  static int l = 0;
  int wn = fl_utf8toUtf16(str, n, (unsigned short*)buf, l);
  if(wn >= l) {
    buf = (xchar*) realloc(buf, sizeof(xchar) * (wn + 1));
    l = wn + 1;
    wn = fl_utf8toUtf16(str, n, (unsigned short*)buf, l);
  }
  n = wn;

  int i;
  for (i = 0; i < n; i++) {
    unsigned int r;
    r = (str[i] & 0xFC00) >> 10;
    if (!gl_fontsize->glok[r]) get_list(r);
  }
  glCallLists(n, GL_UNSIGNED_SHORT, buf);
#endif
}